

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

JSON * chaiscript::json::JSONParser::parse_number
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  runtime_error *prVar6;
  type_conflict8 tVar7;
  int iVar8;
  type_conflict1 tVar9;
  __type_conflict1 _Var10;
  __sv_type _Var11;
  string_view t_str;
  string_view t_str_00;
  string_view t_str_01;
  string_view t_str_02;
  chaiscript *local_1a0;
  chaiscript *local_190;
  chaiscript *local_178;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  __sv_type local_100;
  undefined1 local_ea;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  byte local_71;
  long lStack_70;
  bool isExpNegative;
  int64_t exp;
  undefined1 local_60 [5];
  bool isNegative;
  bool isDouble;
  char c;
  string exp_str;
  string val;
  size_t *offset_local;
  string *str_local;
  
  std::__cxx11::string::string((string *)(exp_str.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  exp._7_1_ = '\0';
  exp._6_1_ = 0;
  exp._5_1_ = 0;
  lStack_70 = 0;
  local_71 = 0;
  uVar1 = *offset;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(str)
  ;
  if ((uVar1 < sVar4) &&
     (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (str,*offset), *pvVar5 == '-')) {
    exp._5_1_ = 1;
    *offset = *offset + 1;
  }
  while (uVar1 = *offset,
        sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(str), uVar1 < sVar4) {
    sVar4 = *offset;
    *offset = sVar4 + 1;
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,sVar4);
    exp._7_1_ = *pvVar5;
    if ((exp._7_1_ < '0') || ('9' < exp._7_1_)) {
      if ((exp._7_1_ != '.') || ((exp._6_1_ & 1) != 0)) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&exp_str.field_2 + 8),'.');
      exp._6_1_ = 1;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&exp_str.field_2 + 8),exp._7_1_);
    }
  }
  uVar1 = *offset;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(str)
  ;
  if ((uVar1 < sVar4) && ((exp._7_1_ == 'E' || (exp._7_1_ == 'e')))) {
    sVar4 = *offset;
    *offset = sVar4 + 1;
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,sVar4);
    exp._7_1_ = *pvVar5;
    if (exp._7_1_ == '-') {
      local_71 = 1;
    }
    else if (exp._7_1_ != '+') {
      *offset = *offset - 1;
    }
    while (uVar1 = *offset,
          sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(str), uVar1 < sVar4) {
      sVar4 = *offset;
      *offset = sVar4 + 1;
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (str,sVar4);
      exp._7_1_ = *pvVar5;
      if ((exp._7_1_ < '0') || ('9' < exp._7_1_)) {
        uVar3 = isspace((int)exp._7_1_);
        if ((((uVar3 & 1) == 0) && ((exp._7_1_ != ',' && (exp._7_1_ != ']')))) && (exp._7_1_ != '}')
           ) {
          local_ea = 1;
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,
                     "JSON ERROR: Number: Expected a number for exponent, found \'",&local_e9);
          std::operator+(&local_c8,&local_e8,exp._7_1_);
          std::operator+(&local_a8,&local_c8,"\'");
          std::runtime_error::runtime_error(prVar6,(string *)&local_a8);
          local_ea = 0;
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 exp._7_1_);
    }
    local_100 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    t_str._M_str = local_100._M_str;
    t_str._M_len = (size_t)t_str._M_str;
    tVar7 = parse_num<long>((chaiscript *)local_100._M_len,t_str);
    iVar8 = 1;
    if ((local_71 & 1) != 0) {
      iVar8 = -1;
    }
    lStack_70 = tVar7 * iVar8;
  }
  else {
    uVar1 = *offset;
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (str);
    if ((uVar1 < sVar4) &&
       ((((uVar3 = isspace((int)exp._7_1_), (uVar3 & 1) == 0 && (exp._7_1_ != ',')) &&
         (exp._7_1_ != ']')) && (exp._7_1_ != '}')))) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"JSON ERROR: Number: unexpected character \'",&local_161);
      std::operator+(&local_140,&local_160,exp._7_1_);
      std::operator+(&local_120,&local_140,"\'");
      std::runtime_error::runtime_error(prVar6,(string *)&local_120);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  *offset = *offset - 1;
  if ((exp._6_1_ & 1) == 0) {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
    if (bVar2) {
      iVar8 = 1;
      if ((exp._5_1_ & 1) != 0) {
        iVar8 = -1;
      }
      _Var11 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(exp_str.field_2._M_local_buf + 8));
      t_str_02._M_str = _Var11._M_str;
      local_1a0 = (chaiscript *)_Var11._M_len;
      t_str_02._M_len = (size_t)t_str_02._M_str;
      tVar7 = parse_num<long>(local_1a0,t_str_02);
      JSON::JSON<long>(__return_storage_ptr__,iVar8 * tVar7,(type *)0x0);
    }
    else {
      uVar3 = (uint)exp._5_1_;
      _Var11 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(exp_str.field_2._M_local_buf + 8));
      t_str_01._M_str = _Var11._M_str;
      local_190 = (chaiscript *)_Var11._M_len;
      t_str_01._M_len = (size_t)t_str_01._M_str;
      tVar7 = parse_num<long>(local_190,t_str_01);
      _Var10 = std::pow<int,long>(10,lStack_70);
      JSON::JSON<double>(__return_storage_ptr__,
                         (double)(int)(-(uVar3 & 1) | 1) * (double)tVar7 * _Var10,(type *)0x0);
    }
  }
  else {
    uVar3 = (uint)exp._5_1_;
    _Var11 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)(exp_str.field_2._M_local_buf + 8));
    t_str_00._M_str = _Var11._M_str;
    local_178 = (chaiscript *)_Var11._M_len;
    t_str_00._M_len = (size_t)t_str_00._M_str;
    tVar9 = parse_num<double>(local_178,t_str_00);
    _Var10 = std::pow<int,long>(10,lStack_70);
    JSON::JSON<double>(__return_storage_ptr__,(double)(int)(-(uVar3 & 1) | 1) * tVar9 * _Var10,
                       (type *)0x0);
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(exp_str.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_number(const std::string &str, size_t &offset) {
      std::string val, exp_str;
      char c = '\0';
      bool isDouble = false;
      bool isNegative = false;
      std::int64_t exp = 0;
      bool isExpNegative = false;
      if (offset < str.size() && str.at(offset) == '-') {
        isNegative = true;
        ++offset;
      }
      for (; offset < str.size();) {
        c = str.at(offset++);
        if (c >= '0' && c <= '9') {
          val += c;
        } else if (c == '.' && !isDouble) {
          val += c;
          isDouble = true;
        } else {
          break;
        }
      }
      if (offset < str.size() && (c == 'E' || c == 'e')) {
        c = str.at(offset++);
        if (c == '-') {
          isExpNegative = true;
        } else if (c == '+') {
          // do nothing
        } else {
          --offset;
        }

        for (; offset < str.size();) {
          c = str.at(offset++);
          if (c >= '0' && c <= '9') {
            exp_str += c;
          } else if (!isspace(c) && c != ',' && c != ']' && c != '}') {
            throw std::runtime_error(std::string("JSON ERROR: Number: Expected a number for exponent, found '") + c + "'");
          } else {
            break;
          }
        }
        exp = chaiscript::parse_num<std::int64_t>(exp_str) * (isExpNegative ? -1 : 1);
      } else if (offset < str.size() && (!isspace(c) && c != ',' && c != ']' && c != '}')) {
        throw std::runtime_error(std::string("JSON ERROR: Number: unexpected character '") + c + "'");
      }
      --offset;

      if (isDouble) {
        return JSON((isNegative ? -1 : 1) * chaiscript::parse_num<double>(val) * std::pow(10, exp));
      } else {
        if (!exp_str.empty()) {
          return JSON((isNegative ? -1 : 1) * static_cast<double>(chaiscript::parse_num<std::int64_t>(val)) * std::pow(10, exp));
        } else {
          return JSON((isNegative ? -1 : 1) * chaiscript::parse_num<std::int64_t>(val));
        }
      }
    }